

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratbuilder.cpp
# Opt level: O1

void __thiscall CaDiCaL::LratBuilder::collect_garbage_clauses(LratBuilder *this)

{
  int64_t *piVar1;
  vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_> *this_00;
  pointer pvVar2;
  pointer pLVar3;
  pointer ppLVar4;
  LratBuilderClause *pLVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  LratBuilderClause *pLVar9;
  int iVar10;
  iterator i;
  pointer ppLVar11;
  uint uVar12;
  pointer pLVar13;
  ulong uVar14;
  pointer ppLVar15;
  pointer pLVar16;
  int iVar17;
  long lVar18;
  
  piVar1 = &(this->stats).collections;
  *piVar1 = *piVar1 + 1;
  lVar18 = (long)(1 - (int)this->size_vars);
  if (lVar18 < this->size_vars) {
    do {
      if (lVar18 != 0) {
        iVar17 = (int)lVar18;
        iVar10 = -iVar17;
        if (0 < iVar17) {
          iVar10 = iVar17;
        }
        uVar12 = ~(uint)(-1 < lVar18) + iVar10 * 2;
        pvVar2 = (this->watchers).
                 super__Vector_base<std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>,_std::allocator<std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar3 = *(pointer *)
                  ((long)&pvVar2[uVar12].
                          super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                          ._M_impl.super__Vector_impl_data + 8);
        pLVar16 = pvVar2[uVar12].
                  super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pLVar13 = pLVar16;
        for (; pLVar16 != pLVar3; pLVar16 = pLVar16 + 1) {
          if (pLVar16->clause->garbage == false) {
            uVar6 = pLVar16->size;
            uVar7 = *(undefined4 *)&pLVar16->clause;
            uVar8 = *(undefined4 *)((long)&pLVar16->clause + 4);
            pLVar13->blit = pLVar16->blit;
            pLVar13->size = uVar6;
            *(undefined4 *)&pLVar13->clause = uVar7;
            *(undefined4 *)((long)&pLVar13->clause + 4) = uVar8;
            pLVar13 = pLVar13 + 1;
          }
        }
        this_00 = pvVar2 + uVar12;
        if (pLVar13 !=
            (this_00->
            super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          pLVar16 = (this_00->
                    super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((long)pLVar13 - (long)pLVar16 == 0) {
            uVar14 = (long)(this_00->
                           super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
                           )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar16;
            if (uVar14 != 0) {
              (this_00->
              super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
              )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (this_00->
              super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
              )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (this_00->
              super__Vector_base<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (pLVar16 != (pointer)0x0) {
                operator_delete(pLVar16,uVar14);
              }
            }
          }
          else {
            std::vector<CaDiCaL::LratBuilderWatch,_std::allocator<CaDiCaL::LratBuilderWatch>_>::
            resize(this_00,(long)pLVar13 - (long)pLVar16 >> 4);
          }
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < this->size_vars);
  }
  ppLVar4 = (this->unit_clauses).
            super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppLVar11 = (this->unit_clauses).
             super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppLVar15 = ppLVar11;
  for (; ppLVar11 != ppLVar4; ppLVar11 = ppLVar11 + 1) {
    if ((*ppLVar11)->garbage == false) {
      *ppLVar15 = *ppLVar11;
      ppLVar15 = ppLVar15 + 1;
    }
  }
  std::vector<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>::resize
            (&this->unit_clauses,
             (long)ppLVar15 -
             (long)(this->unit_clauses).
                   super__Vector_base<CaDiCaL::LratBuilderClause_*,_std::allocator<CaDiCaL::LratBuilderClause_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  pLVar9 = this->garbage;
  while (pLVar9 != (LratBuilderClause *)0x0) {
    pLVar5 = pLVar9->next;
    (&this->num_clauses)[pLVar9->garbage] = (&this->num_clauses)[pLVar9->garbage] - 1;
    operator_delete__(pLVar9);
    pLVar9 = pLVar5;
  }
  this->garbage = (LratBuilderClause *)0x0;
  return;
}

Assistant:

void LratBuilder::collect_garbage_clauses () {

  stats.collections++;

  LOG ("LRAT BUILDER collecting %" PRIu64 " garbage clauses %.0f%%",
       num_garbage, percent (num_garbage, num_clauses));

  for (int lit = -size_vars + 1; lit < size_vars; lit++) {
    if (!lit)
      continue;
    LratBuilderWatcher &ws = watcher (lit);
    const auto end = ws.end ();
    auto j = ws.begin (), i = j;
    for (; i != end; i++) {
      LratBuilderWatch &w = *i;
      if (!w.clause->garbage)
        *j++ = w;
    }
    if (j == ws.end ())
      continue;
    if (j == ws.begin ())
      erase_vector (ws);
    else
      ws.resize (j - ws.begin ());
  }

  const auto end = unit_clauses.end ();
  auto j = unit_clauses.begin ();
  for (auto i = j; i != end; i++) {
    LratBuilderClause *c = *i;
    if (c->garbage)
      continue; // garbage clause
    *j++ = c;
  }
  unit_clauses.resize (j - unit_clauses.begin ());

  for (LratBuilderClause *c = garbage, *next; c; c = next)
    next = c->next, delete_clause (c);

  assert (!num_garbage);
  garbage = 0;
}